

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# to-renderscene-main.cc
# Opt level: O1

int main(int argc,char **argv)

{
  char *pcVar1;
  uint uVar2;
  size_type sVar3;
  undefined8 __nptr;
  char cVar4;
  bool bVar5;
  int iVar6;
  size_t sVar7;
  undefined7 uVar12;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  int *piVar8;
  ostream *poVar9;
  long *plVar10;
  long lVar11;
  size_type *psVar13;
  long *plVar14;
  ulong uVar15;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar16;
  int iVar17;
  char cVar18;
  char *pcVar19;
  char *pcVar20;
  ulong __val;
  int iVar21;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  string obj_str;
  string mtl_filename;
  string obj_filename;
  string mtl_str;
  string err;
  string warn;
  string filepath;
  string __str;
  string usd_basedir;
  AssetResolutionResolver arr;
  USDZAsset usdz_asset;
  RenderScene render_scene;
  RenderSceneConverter converter;
  RenderSceneConverterEnv env;
  Stage stage;
  undefined1 local_2250 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2230;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2220;
  ulong local_2210;
  long *local_2208;
  long local_2200;
  long local_21f8;
  long lStack_21f0;
  double local_21e8;
  string local_21e0;
  int local_21bc;
  string local_21b8;
  char *local_2198;
  string local_2190;
  string local_2170;
  ulong local_2150;
  ulong local_2148;
  ulong local_2140;
  long *local_2138;
  uint local_2130;
  long local_2128 [2];
  string local_2118;
  undefined1 local_20f8 [8];
  _Alloc_hider local_20f0;
  undefined1 local_20e8 [24];
  pointer local_20d0;
  pointer pbStack_20c8;
  pointer local_20c0;
  size_t local_20b8;
  _Rb_tree_node_base local_20a8;
  size_t local_2088;
  ios_base local_2000 [264];
  USDZAsset local_1ef8;
  RenderScene local_1ea0;
  undefined1 local_1ce8 [16];
  undefined1 local_1cd8 [32];
  _Alloc_hider local_1cb8;
  _Base_ptr p_Stack_1cb0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1ca8;
  _Alloc_hider local_1c98;
  size_type sStack_1c90;
  undefined1 local_1c80 [48];
  char local_1c50 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c48;
  _Alloc_hider local_1c38;
  size_type local_1c30;
  _Rb_tree_node_base local_1c20;
  size_type local_1c00;
  undefined1 local_1bf0 [48];
  char local_1bc0 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1bb8;
  _Alloc_hider local_1ba8;
  size_type local_1ba0;
  undefined1 local_1b90 [48];
  _Rb_tree_color local_1b60 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b58;
  optional<tinyusdz::Path::PathType> local_1b48;
  size_t local_1b40;
  char local_1b30 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b28;
  _Alloc_hider local_1b18;
  size_type local_1b10;
  undefined1 local_1b00 [48];
  char local_1ad0 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1ac8;
  _Alloc_hider local_1ab8;
  size_type local_1ab0;
  undefined1 local_1aa0 [48];
  undefined1 local_1a70 [48];
  storage_union local_1a40;
  storage_union *local_1a30;
  storage_union *local_1a28;
  pointer local_1a20;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1a00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_19f8;
  _Base_ptr local_19f0;
  _Rb_tree_node_base local_19e0;
  size_t local_19c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_19b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_19a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1998;
  size_t local_1990;
  int local_1988;
  undefined1 local_1980 [240];
  _Alloc_hider local_1890;
  size_type local_1888;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1880;
  _Alloc_hider local_1870;
  size_type local_1868;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1860;
  _Alloc_hider local_1850;
  size_type local_1848;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1840;
  RenderSceneConverterEnv local_1828;
  undefined1 local_1698 [32];
  _Rb_tree_node_base local_1678;
  size_t local_1658;
  _Alloc_hider local_1650;
  size_type local_1648;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1640;
  int64_t local_1630;
  LayerMetas local_1628;
  _Alloc_hider local_100;
  size_type local_f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f0;
  _Alloc_hider local_e0;
  size_type local_d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d0;
  _Rb_tree_node_base local_b8;
  size_t local_98;
  _Rb_tree_node_base local_88;
  size_t local_68;
  undefined2 local_60;
  pointer local_58;
  pointer puStack_50;
  pointer local_48;
  unsigned_long local_40;
  bool local_38;
  
  if (argc < 2) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Usage: ",7);
    pcVar1 = *argv;
    if (pcVar1 == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x6d72e8);
    }
    else {
      sVar7 = strlen(pcVar1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar1,sVar7);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout," input.usd [OPTIONS].\n",0x16);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n\nOptions\n\n",0xb);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"  --timecode VALUE: Specify timecode value(e.g. 3.14)\n",0x36)
    ;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"  --noidxbuild: Do not rebuild vertex indices\n",0x2e);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"  --notri: Do not triangulate mesh\n",0x23);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"  --nousdprint: Do not print parsed USD\n",0x28);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "  --dumpobj: Dump mesh as wavefront .obj(for visual debugging)\n",0x3f);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"  --dumpusd: Dump scene as USD(USDA Ascii)\n",0x2b);
    iVar21 = 1;
  }
  else {
    local_2170._M_dataplus._M_p = (pointer)&local_2170.field_2;
    local_2170._M_string_length = 0;
    local_2170.field_2._M_local_buf[0] = '\0';
    iVar17 = 1;
    bVar5 = true;
    local_21e8 = NAN;
    local_2140 = 0;
    uVar12 = (undefined7)((ulong)local_2170._M_dataplus._M_p >> 8);
    local_2198 = (char *)CONCAT44(local_2198._4_4_,(int)CONCAT71(uVar12,1));
    local_2210 = CONCAT44(local_2210._4_4_,(int)CONCAT71(uVar12,1));
    local_2150 = 0;
    local_2148 = 0;
    iVar21 = 0;
    do {
      pcVar1 = argv[iVar17];
      iVar6 = strcmp(pcVar1,"--notri");
      if (iVar6 == 0) {
        local_2210 = local_2210 & 0xffffffff00000000;
      }
      else {
        iVar6 = strcmp(pcVar1,"--noidxbuild");
        if (iVar6 == 0) {
          local_2198 = (char *)((ulong)local_2198 & 0xffffffff00000000);
        }
        else {
          iVar6 = strcmp(pcVar1,"--nousdprint");
          if (iVar6 == 0) {
            local_2140 = CONCAT71((int7)(CONCAT44(extraout_var,iVar6) >> 8),1);
          }
          else {
            iVar6 = strcmp(pcVar1,"--dumpobj");
            if (iVar6 == 0) {
              local_2148 = CONCAT71((int7)(CONCAT44(extraout_var_00,iVar6) >> 8),1);
            }
            else {
              iVar6 = strcmp(pcVar1,"--dumpusd");
              if (iVar6 == 0) {
                local_2150 = CONCAT71((int7)(CONCAT44(extraout_var_01,iVar6) >> 8),1);
              }
              else {
                iVar6 = strcmp(pcVar1,"--timecode");
                sVar3 = local_2170._M_string_length;
                if (iVar6 == 0) {
                  iVar17 = iVar17 + 1;
                  if (argc <= iVar17) {
                    iVar21 = -1;
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cerr,"arg is missing for --timecode flag.\n",0x24);
                    break;
                  }
                  std::__cxx11::string::string
                            ((string *)local_1698,argv[iVar17],(allocator *)local_20f8);
                  __nptr = local_1698._0_8_;
                  piVar8 = __errno_location();
                  local_21bc = *piVar8;
                  *piVar8 = 0;
                  local_21e8 = strtod((char *)__nptr,(char **)local_1ce8);
                  if (local_1ce8._0_8_ == __nptr) {
                    std::__throw_invalid_argument("stod");
LAB_001240fb:
                    std::__throw_out_of_range("stod");
                  }
                  if (*piVar8 == 0) {
                    *piVar8 = local_21bc;
                  }
                  else if (*piVar8 == 0x22) goto LAB_001240fb;
                  if ((pointer)local_1698._0_8_ != (pointer)(local_1698 + 0x10)) {
                    operator_delete((void *)local_1698._0_8_,
                                    (ulong)((long)&(((Path *)local_1698._16_8_)->_prim_part).
                                                   _M_dataplus._M_p + 1));
                  }
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,"Use timecode: ",0xe);
                  poVar9 = std::ostream::_M_insert<double>(local_21e8);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
                }
                else {
                  strlen(pcVar1);
                  std::__cxx11::string::_M_replace((ulong)&local_2170,0,(char *)sVar3,(ulong)pcVar1)
                  ;
                }
              }
            }
          }
        }
      }
      iVar17 = iVar17 + 1;
      bVar5 = iVar17 < argc;
    } while (iVar17 < argc);
    if (!bVar5) {
      local_2190._M_dataplus._M_p = (pointer)&local_2190.field_2;
      local_2190._M_string_length = 0;
      local_2190.field_2._M_local_buf[0] = '\0';
      local_21b8._M_dataplus._M_p = (pointer)&local_21b8.field_2;
      local_21b8._M_string_length = 0;
      local_21b8.field_2._M_local_buf[0] = '\0';
      local_1678._M_left = &local_1678;
      local_1698._16_8_ = (pointer)0x0;
      local_1698._0_8_ = (pointer)0x0;
      local_1698._8_8_ = (pointer)0x0;
      local_1678._M_color = _S_red;
      local_1678._M_parent = (_Base_ptr)0x0;
      local_1658 = 0;
      local_1650._M_p = (pointer)&local_1640;
      local_1648 = 0;
      local_1640._M_local_buf[0] = '\0';
      local_1630 = -1;
      local_1678._M_right = local_1678._M_left;
      tinyusdz::LayerMetas::LayerMetas(&local_1628);
      local_100._M_p = (pointer)&local_f0;
      local_f8 = 0;
      local_f0._M_local_buf[0] = '\0';
      local_e0._M_p = (pointer)&local_d0;
      local_d8 = 0;
      local_d0._M_local_buf[0] = '\0';
      local_b8._M_left = &local_b8;
      local_b8._M_color = _S_red;
      local_b8._M_parent = (_Base_ptr)0x0;
      local_98 = 0;
      local_88._M_left = &local_88;
      local_88._M_color = _S_red;
      local_88._M_parent = (_Base_ptr)0x0;
      local_68 = 0;
      local_60._0_1_ = true;
      local_60._1_1_ = true;
      local_58 = (pointer)0x0;
      puStack_50 = (pointer)0x0;
      local_48 = (pointer)0x0;
      local_40 = 1;
      local_38 = true;
      local_b8._M_right = local_b8._M_left;
      local_88._M_right = local_88._M_left;
      bVar5 = tinyusdz::IsUSD(&local_2170,(string *)0x0);
      if (!bVar5) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"File not found or not a USD format: ",0x24);
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cerr,local_2170._M_dataplus._M_p,
                            local_2170._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
      }
      local_1ca8._M_allocated_capacity = (size_type)&local_1cb8;
      local_1cd8._24_8_ = 0;
      local_1ce8._0_8_ = (pointer)0x4000ffffffff;
      local_1ce8._8_8_ = 1;
      local_1cd8._0_8_ = 0x80000000400;
      local_1cd8._8_8_ = (undefined1 *)0x400000800;
      local_1cd8._16_8_ = (undefined1 *)0x0;
      local_1cb8._M_p = (pointer)0x0;
      p_Stack_1cb0 = (_Base_ptr)0x0;
      local_1c98._M_p = (pointer)0x0;
      sStack_1c90 = 1;
      local_1ca8._8_8_ = local_1ca8._M_allocated_capacity;
      bVar5 = tinyusdz::LoadUSDFromFile
                        (&local_2170,(Stage *)local_1698,&local_2190,&local_21b8,
                         (USDLoadOptions *)local_1ce8);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::FileFormatHandler>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::FileFormatHandler>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::FileFormatHandler>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::FileFormatHandler>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::FileFormatHandler>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::FileFormatHandler>_>_>
                   *)(local_1cd8 + 0x18));
      if (local_2190._M_string_length != 0) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"WARN : ",7);
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cerr,local_2190._M_dataplus._M_p,
                            local_2190._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
      }
      if (local_21b8._M_string_length != 0) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"ERR : ",6);
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cerr,local_21b8._M_dataplus._M_p,
                            local_21b8._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
      }
      if (bVar5) {
        bVar5 = tinyusdz::IsUSDZ(&local_2170);
        if ((local_2140 & 1) == 0) {
          tinyusdz::Stage::ExportToString_abi_cxx11_((string *)local_1ce8,(Stage *)local_1698,false)
          ;
          poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cout,(char *)local_1ce8._0_8_,local_1ce8._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"--------------------------------------",0x26);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
          if ((pointer)local_1ce8._0_8_ != (pointer)local_1cd8) {
            operator_delete((void *)local_1ce8._0_8_,local_1cd8._0_8_ + 1);
          }
        }
        local_1ea0.usd_filename._M_dataplus._M_p = (pointer)&local_1ea0.usd_filename.field_2;
        local_1ea0.usd_filename._M_string_length = 0;
        local_1ea0.usd_filename.field_2._M_local_buf[0] = '\0';
        local_1ea0.meta.copyright._M_dataplus._M_p = (pointer)&local_1ea0.meta.copyright.field_2;
        local_1ea0.meta.copyright._M_string_length = 0;
        local_1ea0.meta.copyright.field_2._M_local_buf[0] = '\0';
        local_1ea0.meta.comment._M_dataplus._M_p = (pointer)&local_1ea0.meta.comment.field_2;
        local_1ea0.meta.comment._M_string_length = 0;
        local_1ea0.meta.comment.field_2._M_local_buf[0] = '\0';
        local_1ea0.meta.upAxis._M_dataplus._M_p = (pointer)&local_1ea0.meta.upAxis.field_2;
        local_1ea0.meta.upAxis.field_2._M_allocated_capacity._0_2_ = 0x59;
        local_1ea0.meta.upAxis._M_string_length = 1;
        local_1ea0.meta.startTimeCode.has_value_ = false;
        local_1ea0.meta.startTimeCode.contained = (storage_t<double>)0x0;
        local_1ea0.meta.endTimeCode.has_value_ = false;
        local_1ea0.meta.endTimeCode.contained = (storage_t<double>)0x0;
        local_1ea0.meta.framesPerSecond = 24.0;
        local_1ea0.meta.timeCodesPerSecond = 24.0;
        local_1ea0.meta.metersPerUnit = 1.0;
        local_1ea0.meta.autoPlay = true;
        local_1ea0.default_root_node = 0;
        memset(&local_1ea0.nodes,0,0xf0);
        local_1cd8._8_8_ = local_1ce8 + 8;
        local_1ce8._8_8_ = local_1ce8._8_8_ & 0xffffffff00000000;
        local_1cd8._0_8_ = 0;
        local_1cd8._24_8_ = 0;
        local_1ca8._8_8_ = &p_Stack_1cb0;
        p_Stack_1cb0 = (_Base_ptr)((ulong)p_Stack_1cb0 & 0xffffffff00000000);
        local_1ca8._M_allocated_capacity = 0;
        sStack_1c90 = 0;
        local_1c80._16_8_ = local_1c80;
        local_1c80._0_4_ = 0;
        local_1c80._8_8_ = (pointer)0x0;
        local_1c80._32_8_ = 0;
        local_1c48._8_8_ = local_1c50;
        local_1c50[0] = '\0';
        local_1c50[1] = '\0';
        local_1c50[2] = '\0';
        local_1c50[3] = '\0';
        local_1c48._M_allocated_capacity = 0;
        local_1c30 = 0;
        local_1c20._M_left = &local_1c20;
        local_1c20._M_color = 0;
        local_1c20._M_parent = (_Base_ptr)0x0;
        local_1c00 = 0;
        local_1bf0._16_8_ = local_1bf0;
        local_1bf0._0_4_ = 0;
        local_1bf0._8_8_ = (pointer)0x0;
        local_1bf0._32_8_ = 0;
        local_1bb8._8_8_ = local_1bc0;
        local_1bc0[0] = '\0';
        local_1bc0[1] = '\0';
        local_1bc0[2] = '\0';
        local_1bc0[3] = '\0';
        local_1bb8._M_allocated_capacity = 0;
        local_1ba0 = 0;
        local_1b90._16_8_ = local_1b90;
        local_1b90._0_4_ = 0;
        local_1b90._8_8_ = (pointer)0x0;
        local_1b90._32_8_ = 0;
        local_1b58._8_8_ = local_1b60;
        local_1b60[0] = _S_red;
        local_1b58._M_allocated_capacity = 0;
        local_1b40 = 0;
        local_1b28._8_8_ = local_1b30;
        local_1b30[0] = '\0';
        local_1b30[1] = '\0';
        local_1b30[2] = '\0';
        local_1b30[3] = '\0';
        local_1b28._M_allocated_capacity = 0;
        local_1b10 = 0;
        local_1b00._16_8_ = local_1b00;
        local_1b00._0_4_ = 0;
        local_1b00._8_8_ = (pointer)0x0;
        local_1b00._32_8_ = 0;
        local_1ac8._8_8_ = local_1ad0;
        local_1ad0[0] = '\0';
        local_1ad0[1] = '\0';
        local_1ad0[2] = '\0';
        local_1ad0[3] = '\0';
        local_1ac8._M_allocated_capacity = 0;
        local_1ab0 = 0;
        local_1aa0._16_8_ = local_1aa0;
        local_1aa0._0_4_ = 0;
        local_1aa0._8_8_ = (pointer)0x0;
        local_1aa0._32_8_ = 0;
        local_1a70._16_8_ = local_1a70;
        local_1a70._0_4_ = _S_red;
        local_1a70._8_8_ = (pointer)0x0;
        local_1a70._32_8_ = 0;
        local_1a30 = &local_1a40;
        local_1a40._0_4_ = 0;
        local_1a40._8_8_ = 0;
        local_1a20 = (pointer)0x0;
        local_1a00 = &local_1a10;
        local_1a10._M_allocated_capacity._0_4_ = 0;
        local_1a10._8_8_ = 0;
        local_19f0 = (_Base_ptr)0x0;
        local_19e0._M_left = &local_19e0;
        local_19e0._M_color = _S_red;
        local_19e0._M_parent = (_Base_ptr)0x0;
        local_19c0 = 0;
        local_19a0 = &local_19b0;
        local_19b0._M_allocated_capacity._0_4_ = _S_red;
        local_19b0._8_8_ = (_Base_ptr)0x0;
        local_1990 = 0;
        local_1988 = -1;
        local_1cd8._16_8_ = local_1cd8._8_8_;
        local_1c98._M_p = (pointer)local_1ca8._8_8_;
        local_1c80._24_8_ = local_1c80._16_8_;
        local_1c38._M_p = (pointer)local_1c48._8_8_;
        local_1c20._M_right = local_1c20._M_left;
        local_1bf0._24_8_ = local_1bf0._16_8_;
        local_1ba8._M_p = (pointer)local_1bb8._8_8_;
        local_1b90._24_8_ = local_1b90._16_8_;
        local_1b48 = (optional<tinyusdz::Path::PathType>)local_1b58._8_8_;
        local_1b18._M_p = (pointer)local_1b28._8_8_;
        local_1b00._24_8_ = local_1b00._16_8_;
        local_1ab8._M_p = (pointer)local_1ac8._8_8_;
        local_1aa0._24_8_ = local_1aa0._16_8_;
        local_1a70._24_8_ = local_1a70._16_8_;
        local_1a28 = local_1a30;
        local_19f8 = local_1a00;
        local_19e0._M_right = local_19e0._M_left;
        local_1998 = local_19a0;
        memset(local_1980,0,0xf0);
        local_1888 = 0;
        local_1880._M_local_buf[0] = '\0';
        local_1870._M_p = (pointer)&local_1860;
        local_1868 = 0;
        local_1860._M_local_buf[0] = '\0';
        local_1850._M_p = (pointer)&local_1840;
        local_1848 = 0;
        local_1840._M_local_buf[0] = '\0';
        local_1890._M_p = (pointer)&local_1880;
        tinyusdz::tydra::RenderSceneConverterEnv::RenderSceneConverterEnv
                  (&local_1828,(Stage *)local_1698);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Triangulate : ",0xe);
        pcVar1 = local_2198;
        uVar2 = (uint)local_2198;
        pcVar20 = "false";
        pcVar19 = "false";
        if ((local_2210 & 1) != 0) {
          pcVar19 = "true";
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,pcVar19,(ulong)((uint)local_2210 & 1) ^ 5);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
        local_1828.mesh_config.triangulate = (bool)((byte)local_2210 & 1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Rebuild vertex indices : ",0x19);
        if (((ulong)pcVar1 & 1) != 0) {
          pcVar20 = "true";
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,pcVar20,(ulong)(uVar2 & 1) ^ 5);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
        local_1828.mesh_config.build_vertex_indices = (bool)((byte)pcVar1 & 1);
        tinyusdz::io::GetBaseDir(&local_2118,(string *)&local_2170);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Add seach path: ",0x10);
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,local_2118._M_dataplus._M_p,
                            local_2118._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
        local_1ef8.asset_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &local_1ef8.asset_map._M_t._M_impl.super__Rb_tree_header._M_header;
        local_1ef8.asset_map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        local_1ef8.asset_map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
        ;
        local_1ef8.asset_map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        local_1ef8.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_1ef8.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_1ef8.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_1ef8.addr = (uint8_t *)0x0;
        local_1ef8.size = 0;
        local_1ef8.asset_map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             local_1ef8.asset_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        if (bVar5) {
          bVar5 = tinyusdz::ReadUSDZAssetInfoFromFile
                            (&local_2170,&local_1ef8,&local_2190,&local_21b8,0x4000);
          if (!bVar5) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"Failed to read USDZ assetInfo from file: ",0x29);
            poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cerr,local_21b8._M_dataplus._M_p,
                                local_21b8._M_string_length);
            std::operator<<(poVar9,"\n");
LAB_0012415f:
            exit(-1);
          }
          if (local_2190._M_string_length != 0) {
            poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cout,local_2190._M_dataplus._M_p,
                                local_2190._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
          }
          local_20f0._M_p = local_20e8 + 8;
          local_20f8 = (undefined1  [8])0x0;
          local_20e8._0_8_ = 2;
          local_20e8._8_3_ = 0x2f2e;
          local_20d0 = (pointer)0x0;
          pbStack_20c8 = (pointer)0x0;
          local_20c0 = (pointer)0x0;
          local_20b8 = 0x100000;
          local_20a8._M_left = &local_20a8;
          local_20a8._M_color = _S_red;
          local_20a8._M_parent = (_Base_ptr)0x0;
          local_2088 = 0;
          local_20a8._M_right = local_20a8._M_left;
          bVar5 = tinyusdz::SetupUSDZAssetResolution
                            ((AssetResolutionResolver *)local_20f8,&local_1ef8);
          if (!bVar5) {
            std::operator<<((ostream *)&std::cerr,"Failed to setup AssetResolution for USDZ asset\n"
                           );
            goto LAB_0012415f;
          }
          tinyusdz::AssetResolutionResolver::operator=
                    (&local_1828.asset_resolver,(AssetResolutionResolver *)local_20f8);
          tinyusdz::AssetResolutionResolver::~AssetResolutionResolver
                    ((AssetResolutionResolver *)local_20f8);
        }
        else {
          local_20f8 = (undefined1  [8])local_20e8;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_20f8,local_2118._M_dataplus._M_p,
                     local_2118._M_dataplus._M_p + local_2118._M_string_length);
          __l._M_len = 1;
          __l._M_array = (iterator)local_20f8;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_2250,__l,(allocator_type *)&local_21e0);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator=(&local_1828.asset_resolver._search_paths,
                      (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_2250);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_2250);
          if (local_20f8 != (undefined1  [8])local_20e8) {
            operator_delete((void *)local_20f8,local_20e8._0_8_ + 1);
          }
        }
        if (!NAN(local_21e8)) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"Use timecode : ",0xf);
          poVar9 = std::ostream::_M_insert<double>(local_21e8);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
        }
        local_1828.timecode = local_21e8;
        bVar5 = tinyusdz::tydra::RenderSceneConverter::ConvertToRenderScene
                          ((RenderSceneConverter *)local_1ce8,&local_1828,&local_1ea0);
        if (bVar5) {
          if (local_1848 != 0) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"ConvertToRenderScene warn: ",0x1b);
            poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cout,local_1850._M_p,local_1848);
            std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
          }
          local_2250._0_8_ = (pointer)(local_2250 + 0x10);
          std::__cxx11::string::_M_construct<char_const*>((string *)local_2250,"kdl","");
          tinyusdz::tydra::DumpRenderScene((string *)local_20f8,&local_1ea0,(string *)local_2250);
          poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cout,(char *)local_20f8,(long)local_20f0._M_p);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
          if (local_20f8 != (undefined1  [8])local_20e8) {
            operator_delete((void *)local_20f8,local_20e8._0_8_ + 1);
          }
          if ((pointer)local_2250._0_8_ != (pointer)(local_2250 + 0x10)) {
            operator_delete((void *)local_2250._0_8_,
                            CONCAT71(local_2250._17_7_,local_2250[0x10]) + 1);
          }
          if (((local_2148 & 1) != 0) &&
             (std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"Dump RenderMesh as wavefront .obj\n",0x22),
             local_1ea0.meshes.
             super__Vector_base<tinyusdz::tydra::RenderMesh,_std::allocator<tinyusdz::tydra::RenderMesh>_>
             ._M_impl.super__Vector_impl_data._M_finish !=
             local_1ea0.meshes.
             super__Vector_base<tinyusdz::tydra::RenderMesh,_std::allocator<tinyusdz::tydra::RenderMesh>_>
             ._M_impl.super__Vector_impl_data._M_start)) {
            local_2210 = ___throw_bad_array_new_length;
            __val = 0;
            local_2198 = _VTT;
            do {
              local_2250._0_8_ = local_2250 + 0x10;
              local_2250._8_8_ = (pointer)0x0;
              local_2250[0x10] = '\0';
              local_21e0._M_dataplus._M_p = (pointer)&local_21e0.field_2;
              local_21e0._M_string_length = 0;
              local_21e0.field_2._M_local_buf[0] = '\0';
              bVar5 = tinyusdz::tydra::export_to_obj
                                (&local_1ea0,(int)__val,(string *)local_2250,&local_21e0,
                                 (string *)&local_2190,(string *)&local_21b8);
              if (!bVar5) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,"obj export error: ",0x12);
                poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                                   ((ostream *)&std::cerr,local_21b8._M_dataplus._M_p,
                                    local_21b8._M_string_length);
                std::operator<<(poVar9,"\n");
                goto LAB_0012415f;
              }
              cVar18 = '\x01';
              local_2230._M_allocated_capacity = (size_type)&local_2220;
              if (9 < __val) {
                uVar15 = __val;
                cVar4 = '\x04';
                do {
                  cVar18 = cVar4;
                  if (uVar15 < 100) {
                    cVar18 = cVar18 + -2;
                    goto LAB_00123799;
                  }
                  if (uVar15 < 1000) {
                    cVar18 = cVar18 + -1;
                    goto LAB_00123799;
                  }
                  if (uVar15 < 10000) goto LAB_00123799;
                  bVar5 = 99999 < uVar15;
                  uVar15 = uVar15 / 10000;
                  cVar4 = cVar18 + '\x04';
                } while (bVar5);
                cVar18 = cVar18 + '\x01';
              }
LAB_00123799:
              std::__cxx11::string::_M_construct((ulong)&local_2230,cVar18);
              std::__detail::__to_chars_10_impl<unsigned_long>
                        ((char *)local_2230._M_allocated_capacity,local_2230._8_4_,__val);
              plVar10 = (long *)std::__cxx11::string::_M_append
                                          (local_2230._M_local_buf,
                                           (ulong)local_1ea0.meshes.
                                                  super__Vector_base<tinyusdz::tydra::RenderMesh,_std::allocator<tinyusdz::tydra::RenderMesh>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[__val].
                                                  prim_name._M_dataplus._M_p);
              local_20f8 = (undefined1  [8])local_20e8;
              psVar13 = (size_type *)(plVar10 + 2);
              if ((size_type *)*plVar10 == psVar13) {
                local_20e8._0_8_ = *psVar13;
                local_20e8._8_8_ = plVar10[3];
              }
              else {
                local_20e8._0_8_ = *psVar13;
                local_20f8 = (undefined1  [8])*plVar10;
              }
              local_20f0._M_p = (pointer)plVar10[1];
              *plVar10 = (long)psVar13;
              plVar10[1] = 0;
              *(undefined1 *)(plVar10 + 2) = 0;
              plVar10 = (long *)std::__cxx11::string::append((char *)local_20f8);
              local_2208 = &local_21f8;
              plVar14 = plVar10 + 2;
              if ((long *)*plVar10 == plVar14) {
                local_21f8 = *plVar14;
                lStack_21f0 = plVar10[3];
              }
              else {
                local_21f8 = *plVar14;
                local_2208 = (long *)*plVar10;
              }
              local_2200 = plVar10[1];
              *plVar10 = (long)plVar14;
              plVar10[1] = 0;
              *(undefined1 *)(plVar10 + 2) = 0;
              if (local_20f8 != (undefined1  [8])local_20e8) {
                operator_delete((void *)local_20f8,local_20e8._0_8_ + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2230._M_allocated_capacity != &local_2220) {
                operator_delete((void *)local_2230._M_allocated_capacity,
                                local_2220._M_allocated_capacity + 1);
              }
              cVar18 = '\x01';
              if (9 < __val) {
                uVar15 = __val;
                cVar4 = '\x04';
                do {
                  cVar18 = cVar4;
                  if (uVar15 < 100) {
                    cVar18 = cVar18 + -2;
                    goto LAB_00123932;
                  }
                  if (uVar15 < 1000) {
                    cVar18 = cVar18 + -1;
                    goto LAB_00123932;
                  }
                  if (uVar15 < 10000) goto LAB_00123932;
                  bVar5 = 99999 < uVar15;
                  uVar15 = uVar15 / 10000;
                  cVar4 = cVar18 + '\x04';
                } while (bVar5);
                cVar18 = cVar18 + '\x01';
              }
LAB_00123932:
              local_2138 = local_2128;
              std::__cxx11::string::_M_construct((ulong)&local_2138,cVar18);
              std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_2138,local_2130,__val);
              plVar10 = (long *)std::__cxx11::string::_M_append
                                          ((char *)&local_2138,
                                           (ulong)local_1ea0.meshes.
                                                  super__Vector_base<tinyusdz::tydra::RenderMesh,_std::allocator<tinyusdz::tydra::RenderMesh>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[__val].
                                                  prim_name._M_dataplus._M_p);
              local_20f8 = (undefined1  [8])local_20e8;
              psVar13 = (size_type *)(plVar10 + 2);
              if ((size_type *)*plVar10 == psVar13) {
                local_20e8._0_8_ = *psVar13;
                local_20e8._8_8_ = plVar10[3];
              }
              else {
                local_20e8._0_8_ = *psVar13;
                local_20f8 = (undefined1  [8])*plVar10;
              }
              local_20f0._M_p = (pointer)plVar10[1];
              *plVar10 = (long)psVar13;
              plVar10[1] = 0;
              *(undefined1 *)(plVar10 + 2) = 0;
              plVar10 = (long *)std::__cxx11::string::append((char *)local_20f8);
              pcVar1 = local_2198;
              local_2230._M_allocated_capacity = (size_type)&local_2220;
              paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(plVar10 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar10 == paVar16) {
                local_2220._M_allocated_capacity = paVar16->_M_allocated_capacity;
                local_2220._8_8_ = plVar10[3];
              }
              else {
                local_2220._M_allocated_capacity = paVar16->_M_allocated_capacity;
                local_2230._M_allocated_capacity =
                     (size_type)
                     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)*plVar10;
              }
              local_2230._8_8_ = plVar10[1];
              *plVar10 = (long)paVar16;
              plVar10[1] = 0;
              *(undefined1 *)(plVar10 + 2) = 0;
              if (local_20f8 != (undefined1  [8])local_20e8) {
                operator_delete((void *)local_20f8,local_20e8._0_8_ + 1);
              }
              if (local_2138 != local_2128) {
                operator_delete(local_2138,local_2128[0] + 1);
              }
              std::ofstream::ofstream((string *)local_20f8,(string *)&local_2208,_S_out);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_20f8,(char *)local_2250._0_8_,local_2250._8_8_);
              local_20f8 = (undefined1  [8])pcVar1;
              *(ulong *)(local_20f8 + *(long *)(pcVar1 + -0x18)) = local_2210;
              std::filebuf::~filebuf((filebuf *)&local_20f0);
              std::ios_base::~ios_base(local_2000);
              std::ofstream::ofstream((string *)local_20f8,(string *)local_2230._M_local_buf,_S_out)
              ;
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_20f8,local_21e0._M_dataplus._M_p,
                         local_21e0._M_string_length);
              local_20f8 = (undefined1  [8])pcVar1;
              *(ulong *)(local_20f8 + *(long *)(pcVar1 + -0x18)) = local_2210;
              std::filebuf::~filebuf((filebuf *)&local_20f0);
              std::ios_base::~ios_base(local_2000);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  Wrote ",8)
              ;
              poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)&std::cout,(char *)local_2208,local_2200);
              std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2230._M_allocated_capacity != &local_2220) {
                operator_delete((void *)local_2230._M_allocated_capacity,
                                local_2220._M_allocated_capacity + 1);
              }
              if (local_2208 != &local_21f8) {
                operator_delete(local_2208,local_21f8 + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_21e0._M_dataplus._M_p != &local_21e0.field_2) {
                operator_delete(local_21e0._M_dataplus._M_p,
                                CONCAT71(local_21e0.field_2._M_allocated_capacity._1_7_,
                                         local_21e0.field_2._M_local_buf[0]) + 1);
              }
              if ((pointer)local_2250._0_8_ != (pointer)(local_2250 + 0x10)) {
                operator_delete((void *)local_2250._0_8_,
                                CONCAT71(local_2250._17_7_,local_2250[0x10]) + 1);
              }
              __val = __val + 1;
            } while (__val < (ulong)(((long)local_1ea0.meshes.
                                            super__Vector_base<tinyusdz::tydra::RenderMesh,_std::allocator<tinyusdz::tydra::RenderMesh>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)local_1ea0.meshes.
                                            super__Vector_base<tinyusdz::tydra::RenderMesh,_std::allocator<tinyusdz::tydra::RenderMesh>_>
                                            ._M_impl.super__Vector_impl_data._M_start >> 5) *
                                    -0x7063e7063e7063e7));
          }
          if ((local_2150 & 1) != 0) {
            tinyusdz::io::GetFileExtension((string *)local_2250,(string *)&local_2170);
            tinyusdz::io::GetBaseFilename(&local_21e0,(string *)&local_2170);
            if ((local_21e0._M_string_length < (ulong)local_2250._8_8_) ||
               (lVar11 = std::__cxx11::string::find
                                   ((char *)&local_21e0,local_2250._0_8_,
                                    local_21e0._M_string_length - local_2250._8_8_), lVar11 == -1))
            {
              local_20f8 = (undefined1  [8])local_20e8;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)local_20f8,local_21e0._M_dataplus._M_p,
                         local_21e0._M_dataplus._M_p +
                         (long)(_Alloc_hider *)local_21e0._M_string_length);
            }
            else {
              std::__cxx11::string::substr((ulong)local_20f8,(ulong)&local_21e0);
            }
            plVar10 = (long *)std::__cxx11::string::append(local_20f8);
            plVar14 = plVar10 + 2;
            if ((long *)*plVar10 == plVar14) {
              local_21f8 = *plVar14;
              lStack_21f0 = plVar10[3];
              local_2208 = &local_21f8;
            }
            else {
              local_21f8 = *plVar14;
              local_2208 = (long *)*plVar10;
            }
            local_2200 = plVar10[1];
            *plVar10 = (long)plVar14;
            plVar10[1] = 0;
            *(undefined1 *)(plVar10 + 2) = 0;
            if (local_20f8 != (undefined1  [8])local_20e8) {
              operator_delete((void *)local_20f8,local_20e8._0_8_ + 1);
            }
            local_2230._8_8_ = 0;
            local_2220._M_allocated_capacity = local_2220._M_allocated_capacity & 0xffffffffffffff00
            ;
            local_2230._M_allocated_capacity = (size_type)&local_2220;
            bVar5 = tinyusdz::tydra::export_to_usda
                              (&local_1ea0,(string *)&local_2230,(string *)&local_2190,
                               (string *)&local_21b8);
            if (!bVar5) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,"Failed to export RenderScene to USDA: ",0x26);
              poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)&std::cerr,local_21b8._M_dataplus._M_p,
                                  local_21b8._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
            }
            if (local_2190._M_string_length != 0) {
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"WARN: ",6);
              poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)&std::cout,local_2190._M_dataplus._M_p,
                                  local_2190._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
            }
            std::ofstream::ofstream(local_20f8,(string *)&local_2208,_S_out);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_20f8,(char *)local_2230._M_allocated_capacity,
                       local_2230._8_8_);
            local_20f8 = (undefined1  [8])_VTT;
            *(ulong *)(local_20f8 + *(long *)(_VTT + -0x18)) = ___throw_bad_array_new_length;
            std::filebuf::~filebuf((filebuf *)&local_20f0);
            std::ios_base::~ios_base(local_2000);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"Exported RenderScene as USDA: ",0x1e);
            poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cout,(char *)local_2208,local_2200);
            std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2230._M_allocated_capacity != &local_2220) {
              operator_delete((void *)local_2230._M_allocated_capacity,
                              local_2220._M_allocated_capacity + 1);
            }
            if (local_2208 != &local_21f8) {
              operator_delete(local_2208,local_21f8 + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_21e0._M_dataplus._M_p != &local_21e0.field_2) {
              operator_delete(local_21e0._M_dataplus._M_p,
                              CONCAT71(local_21e0.field_2._M_allocated_capacity._1_7_,
                                       local_21e0.field_2._M_local_buf[0]) + 1);
            }
            if ((pointer)local_2250._0_8_ != (pointer)(local_2250 + 0x10)) {
              operator_delete((void *)local_2250._0_8_,
                              CONCAT71(local_2250._17_7_,local_2250[0x10]) + 1);
            }
          }
          iVar21 = 0;
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Failed to convert USD Stage to RenderScene: \n",0x2d);
          poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cerr,local_1870._M_p,local_1868);
          iVar21 = 1;
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
        }
        if (local_1ef8.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_1ef8.data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_1ef8.data.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_1ef8.data.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>_>
        ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>_>
                     *)&local_1ef8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2118._M_dataplus._M_p != &local_2118.field_2) {
          operator_delete(local_2118._M_dataplus._M_p,local_2118.field_2._M_allocated_capacity + 1);
        }
        tinyusdz::tydra::RenderSceneConverterEnv::~RenderSceneConverterEnv(&local_1828);
        tinyusdz::tydra::RenderSceneConverter::~RenderSceneConverter
                  ((RenderSceneConverter *)local_1ce8);
        tinyusdz::tydra::RenderScene::~RenderScene(&local_1ea0);
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Failed to load USD file: ",0x19);
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cerr,local_2170._M_dataplus._M_p,
                            local_2170._M_string_length);
        iVar21 = 1;
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
      }
      tinyusdz::Stage::~Stage((Stage *)local_1698);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_21b8._M_dataplus._M_p != &local_21b8.field_2) {
        operator_delete(local_21b8._M_dataplus._M_p,
                        CONCAT71(local_21b8.field_2._M_allocated_capacity._1_7_,
                                 local_21b8.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2190._M_dataplus._M_p != &local_2190.field_2) {
        operator_delete(local_2190._M_dataplus._M_p,
                        CONCAT71(local_2190.field_2._M_allocated_capacity._1_7_,
                                 local_2190.field_2._M_local_buf[0]) + 1);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2170._M_dataplus._M_p != &local_2170.field_2) {
      operator_delete(local_2170._M_dataplus._M_p,
                      CONCAT71(local_2170.field_2._M_allocated_capacity._1_7_,
                               local_2170.field_2._M_local_buf[0]) + 1);
    }
  }
  return iVar21;
}

Assistant:

int main(int argc, char **argv) {
  if (argc < 2) {
    std::cout << "Usage: " << argv[0] << " input.usd [OPTIONS].\n";
    std::cout << "\n\nOptions\n\n";
    std::cout << "  --timecode VALUE: Specify timecode value(e.g. 3.14)\n";
    std::cout << "  --noidxbuild: Do not rebuild vertex indices\n";
    std::cout << "  --notri: Do not triangulate mesh\n";
    std::cout << "  --nousdprint: Do not print parsed USD\n";
    std::cout
        << "  --dumpobj: Dump mesh as wavefront .obj(for visual debugging)\n";
    std::cout << "  --dumpusd: Dump scene as USD(USDA Ascii)\n";
    return EXIT_FAILURE;
  }

  // When Xform, Mesh, Material, etc. have time-varying values,
  // values are evaluated at `timecode` time(except for animation values in
  // SkelAnimation)
  double timecode = tinyusdz::value::TimeCode::Default();

  bool build_indices = true;
  bool triangulate = true;
  bool export_obj = false;
  bool export_usd = false;
  bool no_usdprint = false;

  std::string filepath;
  for (int i = 1; i < argc; i++) {
    if (strcmp(argv[i], "--notri") == 0) {
      triangulate = false;
    } else if (strcmp(argv[i], "--noidxbuild") == 0) {
      build_indices = false;
    } else if (strcmp(argv[i], "--nousdprint") == 0) {
      no_usdprint = true;
    } else if (strcmp(argv[i], "--dumpobj") == 0) {
      export_obj = true;
    } else if (strcmp(argv[i], "--dumpusd") == 0) {
      export_usd = true;
    } else if (strcmp(argv[i], "--timecode") == 0) {
      if ((i + 1) >= argc) {
        std::cerr << "arg is missing for --timecode flag.\n";
        return -1;
      }
      timecode = std::stod(argv[i + 1]);
      std::cout << "Use timecode: " << timecode << "\n";
      i++;
    } else {
      filepath = argv[i];
    }
  }

  std::string warn;
  std::string err;

  tinyusdz::Stage stage;

  if (!tinyusdz::IsUSD(filepath)) {
    std::cerr << "File not found or not a USD format: " << filepath << "\n";
  }

  bool ret = tinyusdz::LoadUSDFromFile(filepath, &stage, &warn, &err);
  if (!warn.empty()) {
    std::cerr << "WARN : " << warn << "\n";
  }

  if (!err.empty()) {
    std::cerr << "ERR : " << err << "\n";
  }

  if (!ret) {
    std::cerr << "Failed to load USD file: " << filepath << "\n";
    return EXIT_FAILURE;
  }

  bool is_usdz = tinyusdz::IsUSDZ(filepath);

  if (!no_usdprint) {
    std::string s = stage.ExportToString();
    std::cout << s << "\n";
    std::cout << "--------------------------------------"
              << "\n";
  }

  // RenderScene: Scene graph object which is suited for GL/Vulkan renderer
  tinyusdz::tydra::RenderScene render_scene;
  tinyusdz::tydra::RenderSceneConverter converter;
  tinyusdz::tydra::RenderSceneConverterEnv env(stage);

  std::cout << "Triangulate : " << (triangulate ? "true" : "false") << "\n";
  env.mesh_config.triangulate = triangulate;
  std::cout << "Rebuild vertex indices : " << (build_indices ? "true" : "false")
            << "\n";
  env.mesh_config.build_vertex_indices = build_indices;

  // Add base directory of .usd file to search path.
  std::string usd_basedir = tinyusdz::io::GetBaseDir(filepath);
  std::cout << "Add seach path: " << usd_basedir << "\n";

  tinyusdz::USDZAsset usdz_asset;
  if (is_usdz) {
    // Setup AssetResolutionResolver to read a asset(file) from memory.
    if (!tinyusdz::ReadUSDZAssetInfoFromFile(filepath, &usdz_asset, &warn,
                                             &err)) {
      std::cerr << "Failed to read USDZ assetInfo from file: " << err << "\n";
      exit(-1);
    }
    if (warn.size()) {
      std::cout << warn << "\n";
    }

    tinyusdz::AssetResolutionResolver arr;

    // NOTE: Pointer address of usdz_asset must be valid until the call of
    // RenderSceneConverter::ConvertToRenderScene.
    if (!tinyusdz::SetupUSDZAssetResolution(arr, &usdz_asset)) {
      std::cerr << "Failed to setup AssetResolution for USDZ asset\n";
      exit(-1);
    };

    env.asset_resolver = arr;

  } else {
    env.set_search_paths({usd_basedir});

    // TODO: Add example to set user-defined AssetResolutionResolver
    // AssetResolutionResolver arr;
    // ...
    // env.asset_resolver(arr);
  }

  if (!tinyusdz::value::TimeCode(timecode).is_default()) {
    std::cout << "Use timecode : " << timecode << "\n";
  }
  env.timecode = timecode;
  ret = converter.ConvertToRenderScene(env, &render_scene);
  if (!ret) {
    std::cerr << "Failed to convert USD Stage to RenderScene: \n"
              << converter.GetError() << "\n";
    return EXIT_FAILURE;
  }

  if (converter.GetWarning().size()) {
    std::cout << "ConvertToRenderScene warn: " << converter.GetWarning()
              << "\n";
  }

  std::cout << DumpRenderScene(render_scene) << "\n";

  if (export_obj) {
    std::cout << "Dump RenderMesh as wavefront .obj\n";
    for (size_t i = 0; i < render_scene.meshes.size(); i++) {
      std::string obj_str;
      std::string mtl_str;
      if (!tinyusdz::tydra::export_to_obj(render_scene, i, obj_str, mtl_str,
                                          &warn, &err)) {
        std::cerr << "obj export error: " << err << "\n";
        exit(-1);
      }

      std::string obj_filename =
          std::to_string(i) + render_scene.meshes[i].prim_name + ".obj";
      std::string mtl_filename =
          std::to_string(i) + render_scene.meshes[i].prim_name + ".mtl";
      {
        std::ofstream obj_ofs(obj_filename);
        obj_ofs << obj_str;
      }

      {
        std::ofstream mtl_ofs(mtl_filename);
        mtl_ofs << mtl_str;
      }
      std::cout << "  Wrote " << obj_filename << "\n";
    }
  }

  if (export_usd) {
    std::string ext = tinyusdz::io::GetFileExtension(filepath);
    std::string usd_basename = tinyusdz::io::GetBaseFilename(filepath);
    std::string usd_filename =
        tinyusdz::removeSuffix(usd_basename, ext) + "export.usda";

    std::string usda_str;
    if (!tinyusdz::tydra::export_to_usda(render_scene, usda_str, &warn, &err)) {
      std::cerr << "Failed to export RenderScene to USDA: " << err << "\n";
    }
    if (warn.size()) {
      std::cout << "WARN: " << warn << "\n";
    }

    {
      std::ofstream ofs(usd_filename);
      ofs << usda_str;
    }
    std::cout << "Exported RenderScene as USDA: " << usd_filename << "\n";
  }

  return EXIT_SUCCESS;
}